

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprPopulatePoslistsCb
              (void *pCtx,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *__s;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  
  lVar1 = *pCtx;
  iVar7 = 0x8000;
  if (nToken < 0x8000) {
    iVar7 = nToken;
  }
  if ((tflags & 1U) == 0) {
    *(long *)((long)pCtx + 0x10) = *(long *)((long)pCtx + 0x10) + 1;
  }
  iVar5 = *(int *)(lVar1 + 0x1c);
  if (0 < iVar5) {
    lVar8 = 0;
    do {
      lVar2 = *(long *)((long)pCtx + 8);
      if (*(int *)(lVar2 + 8 + lVar8 * 0x10) != 0) {
        lVar3 = *(long *)(*(long *)(lVar1 + 0x20) + lVar8 * 8);
        pcVar9 = (char *)(lVar3 + 0x20);
        do {
          __s = *(char **)(pcVar9 + 8);
          sVar6 = strlen(__s);
          iVar4 = (int)sVar6;
          if (((iVar7 == iVar4) || ((iVar4 < iVar7 && (*pcVar9 != '\0')))) &&
             (iVar4 = bcmp(__s,pToken,(long)iVar4), iVar4 == 0)) {
            iVar5 = sqlite3Fts5PoslistWriterAppend
                              ((Fts5Buffer *)(lVar3 + 8),(Fts5PoslistWriter *)(lVar2 + lVar8 * 0x10)
                               ,*(i64 *)((long)pCtx + 0x10));
            if (iVar5 != 0) {
              return iVar5;
            }
            iVar5 = *(int *)(lVar1 + 0x1c);
            break;
          }
          pcVar9 = *(char **)(pcVar9 + 0x18);
        } while (pcVar9 != (char *)0x0);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar5);
  }
  return 0;
}

Assistant:

static int fts5ExprPopulatePoslistsCb(
  void *pCtx,                /* Copy of 2nd argument to xTokenize() */
  int tflags,                /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,        /* Pointer to buffer containing token */
  int nToken,                /* Size of token in bytes */
  int iUnused1,              /* Byte offset of token within input text */
  int iUnused2               /* Byte offset of end of token within input text */
){
  Fts5ExprCtx *p = (Fts5ExprCtx*)pCtx;
  Fts5Expr *pExpr = p->pExpr;
  int i;

  UNUSED_PARAM2(iUnused1, iUnused2);

  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ) p->iOff++;
  for(i=0; i<pExpr->nPhrase; i++){
    Fts5ExprTerm *pTerm;
    if( p->aPopulator[i].bOk==0 ) continue;
    for(pTerm=&pExpr->apExprPhrase[i]->aTerm[0]; pTerm; pTerm=pTerm->pSynonym){
      int nTerm = (int)strlen(pTerm->zTerm);
      if( (nTerm==nToken || (nTerm<nToken && pTerm->bPrefix))
       && memcmp(pTerm->zTerm, pToken, nTerm)==0
      ){
        int rc = sqlite3Fts5PoslistWriterAppend(
            &pExpr->apExprPhrase[i]->poslist, &p->aPopulator[i].writer, p->iOff
        );
        if( rc ) return rc;
        break;
      }
    }
  }
  return SQLITE_OK;
}